

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void icetSingleImageCollect
               (IceTSparseImage input_image,IceTInt dest,IceTSizeType piece_offset,
               IceTImage result_image)

{
  IceTSizeType IVar1;
  IceTVoid *pIVar2;
  int local_bc;
  int proc_1;
  IceTByte *depth_buffer;
  int proc;
  IceTByte *color_buffer;
  undefined1 local_98 [8];
  IceTByte dummy_buffer [64];
  IceTSizeType local_4c;
  IceTSizeType local_48;
  IceTSizeType depth_size;
  IceTSizeType color_size;
  IceTEnum depth_format;
  IceTEnum color_format;
  IceTSizeType piece_size;
  IceTInt numproc;
  IceTInt rank;
  IceTSizeType *sizes;
  IceTSizeType *offsets;
  IceTSizeType piece_offset_local;
  IceTInt dest_local;
  IceTImage result_image_local;
  IceTSparseImage input_image_local;
  
  local_48 = 1;
  local_4c = 1;
  offsets._0_4_ = piece_offset;
  offsets._4_4_ = dest;
  _piece_offset_local = result_image.opaque_internals;
  result_image_local.opaque_internals = input_image.opaque_internals;
  piece_size = icetCommRank();
  color_format = icetCommSize();
  depth_format = icetSparseImageGetNumPixels((IceTSparseImage)result_image_local.opaque_internals);
  if (piece_size == offsets._4_4_) {
    sizes = (IceTSizeType *)icetGetStateBuffer(0x186,color_format << 2);
    _numproc = (IceTSizeType *)icetGetStateBuffer(0x187,color_format << 2);
  }
  else {
    sizes = (IceTSizeType *)0x0;
    _numproc = (IceTSizeType *)0x0;
  }
  icetCommGather(&offsets,1,0x8003,sizes,offsets._4_4_);
  icetCommGather(&depth_format,1,0x8003,_numproc,offsets._4_4_);
  if ((int)depth_format < 1) {
    if (piece_size != offsets._4_4_) {
      IVar1 = icetImageBufferSize(0,0);
      if (0x40 < IVar1) {
        icetRaiseDiagnostic("Oops.  My dummy buffer is not big enough.",0xffffffff,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/strategies/common.c"
                            ,0x200);
        return;
      }
      _piece_offset_local = icetImageAssignBuffer(local_98,0,0);
    }
  }
  else {
    icetDecompressSubImage
              ((IceTSparseImage)result_image_local.opaque_internals,(IceTSizeType)offsets,
               _piece_offset_local);
  }
  icetImageAdjustForOutput(_piece_offset_local);
  icetTimingCollectBegin();
  color_size = icetImageGetColorFormat(_piece_offset_local);
  depth_size = icetImageGetDepthFormat(_piece_offset_local);
  if (color_size != 0xc000) {
    pIVar2 = icetImageGetColorVoid(_piece_offset_local,&local_48);
    if (piece_size == offsets._4_4_) {
      for (depth_buffer._4_4_ = 0; depth_buffer._4_4_ < (int)color_format;
          depth_buffer._4_4_ = depth_buffer._4_4_ + 1) {
        sizes[depth_buffer._4_4_] = local_48 * sizes[depth_buffer._4_4_];
        _numproc[depth_buffer._4_4_] = local_48 * _numproc[depth_buffer._4_4_];
      }
      icetCommGatherv((void *)0xffffffffffffffff,_numproc[piece_size],0x8001,pIVar2,_numproc,sizes,
                      offsets._4_4_);
    }
    else {
      icetCommGatherv((void *)((long)pIVar2 + (long)((IceTSizeType)offsets * local_48)),
                      depth_format * local_48,0x8001,(void *)0x0,(IceTSizeType *)0x0,
                      (IceTSizeType *)0x0,offsets._4_4_);
    }
  }
  if (depth_size != 0xd000) {
    pIVar2 = icetImageGetDepthVoid(_piece_offset_local,&local_4c);
    if (piece_size == offsets._4_4_) {
      if (local_48 != local_4c) {
        for (local_bc = 0; local_bc < (int)color_format; local_bc = local_bc + 1) {
          sizes[local_bc] = sizes[local_bc] / local_48;
          sizes[local_bc] = local_4c * sizes[local_bc];
          _numproc[local_bc] = _numproc[local_bc] / local_48;
          _numproc[local_bc] = local_4c * _numproc[local_bc];
        }
      }
      icetCommGatherv((void *)0xffffffffffffffff,_numproc[piece_size],0x8001,pIVar2,_numproc,sizes,
                      offsets._4_4_);
    }
    else {
      icetCommGatherv((void *)((long)pIVar2 + (long)((IceTSizeType)offsets * local_4c)),
                      depth_format * local_4c,0x8001,(void *)0x0,(IceTSizeType *)0x0,
                      (IceTSizeType *)0x0,offsets._4_4_);
    }
  }
  icetTimingCollectEnd();
  return;
}

Assistant:

void icetSingleImageCollect(const IceTSparseImage input_image,
                            IceTInt dest,
                            IceTSizeType piece_offset,
                            IceTImage result_image)
{
    IceTSizeType *offsets;
    IceTSizeType *sizes;
    IceTInt rank;
    IceTInt numproc;

    IceTSizeType piece_size;

    IceTEnum color_format;
    IceTEnum depth_format;
    IceTSizeType color_size = 1;
    IceTSizeType depth_size = 1;

#define DUMMY_BUFFER_SIZE       ((IceTSizeType)(16*sizeof(IceTInt)))
    IceTByte dummy_buffer[DUMMY_BUFFER_SIZE];

    rank = icetCommRank();
    numproc = icetCommSize();

    /* Collect partitions held by each process. */
    piece_size = icetSparseImageGetNumPixels(input_image);
    if (rank == dest) {
        offsets = icetGetStateBuffer(ICET_IMAGE_COLLECT_OFFSET_BUF,
                                     sizeof(IceTSizeType)*numproc);
        sizes = icetGetStateBuffer(ICET_IMAGE_COLLECT_SIZE_BUF,
                                   sizeof(IceTSizeType)*numproc);
    } else {
        offsets = NULL;
        sizes = NULL;
    }
    /* Technically, these gathers are part of the collection process and should
       therefore be timed.  However, unless the compositing is very well load
       balanced (and typically it is not), different processes will arrive here
       at different times.  These gathers act something like a barrier that
       helps separate the time spent collecting final pixels from the time spent
       in transferring and compositing fragments. */
    icetCommGather(&piece_offset, 1, ICET_SIZE_TYPE, offsets, dest);
    icetCommGather(&piece_size, 1, ICET_SIZE_TYPE, sizes, dest);

#ifdef DEBUG
    if (rank == dest) {
        IceTVoid *data;
        IceTSizeType size;
        if (icetImageGetColorFormat(result_image) != ICET_IMAGE_COLOR_NONE) {
            data = icetImageGetColorVoid(result_image, &size);
            memset(data, 0xCD, icetImageGetNumPixels(result_image)*size);
        }
        if (icetImageGetDepthFormat(result_image) != ICET_IMAGE_DEPTH_NONE) {
            data = icetImageGetDepthVoid(result_image, &size);
            memset(data, 0xCD, icetImageGetNumPixels(result_image)*size);
        }
    }
#endif

    if (piece_size > 0) {
        /* Decompress data into appropriate offset of result image. */
        icetDecompressSubImage(input_image, piece_offset, result_image);
    } else if (rank != dest) {
        /* If this function is called for multiple collections, it is likely
           that the local process will not have data for all collections.  To
           prevent making the calling function allocate an image buffer when it
           is neither sending or receiving data, just allocate a dummy buffer to
           satisfy the following code. */
        if (DUMMY_BUFFER_SIZE < icetImageBufferSize(0, 0)) {
            icetRaiseError("Oops.  My dummy buffer is not big enough.",
                           ICET_SANITY_CHECK_FAIL);
            return;
        }
        result_image = icetImageAssignBuffer(dummy_buffer, 0, 0);
    } else {
        /* Collecting data at empty process.  We still want to use the provided
           result_image, but we have nothing of our own to put in it.  Thus, do
           nothing. */
    }

    /* Adjust image for output as some buffers, such as depth, might be
       dropped. */
    icetImageAdjustForOutput(result_image);

    icetTimingCollectBegin();

    color_format = icetImageGetColorFormat(result_image);
    depth_format = icetImageGetDepthFormat(result_image);

    if (color_format != ICET_IMAGE_COLOR_NONE) {
        /* Use IceTByte for byte-based pointer arithmetic. */
        IceTByte *color_buffer
          = icetImageGetColorVoid(result_image, &color_size);
        int proc;

        if (rank == dest) {
            /* Adjust sizes and offsets to sizes of pixel colors. */
            for (proc = 0; proc < numproc; proc++) {
                offsets[proc] *= color_size;
                sizes[proc] *= color_size;
            }
            icetCommGatherv(ICET_IN_PLACE_COLLECT,
                            sizes[rank],
                            ICET_BYTE,
                            color_buffer,
                            sizes,
                            offsets,
                            dest);
        } else {
            icetCommGatherv(color_buffer + piece_offset * color_size,
                            piece_size * color_size,
                            ICET_BYTE,
                            NULL,
                            NULL,
                            NULL,
                            dest);
        }
    }

    if (depth_format != ICET_IMAGE_DEPTH_NONE) {
        /* Use IceTByte for byte-based pointer arithmetic. */
        IceTByte *depth_buffer
          = icetImageGetDepthVoid(result_image, &depth_size);
        int proc;

        if (rank == dest) {
            /* Adjust sizes and offsets to sizes of pixel depths.  Also
               adjust for any adjustments made for color. */
            if (color_size != depth_size) {
                for (proc = 0; proc < numproc; proc++) {
                    offsets[proc] /= color_size;
                    offsets[proc] *= depth_size;
                    sizes[proc] /= color_size;
                    sizes[proc] *= depth_size;
                }
            }
            icetCommGatherv(ICET_IN_PLACE_COLLECT,
                            sizes[rank],
                            ICET_BYTE,
                            depth_buffer,
                            sizes,
                            offsets,
                            dest);
        } else {
            icetCommGatherv(depth_buffer + piece_offset * depth_size,
                            piece_size * depth_size,
                            ICET_BYTE,
                            NULL,
                            NULL,
                            NULL,
                            dest);
        }
    }

    icetTimingCollectEnd();
}